

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint32_t __fd_00;
  int iVar1;
  undefined4 in_register_00000034;
  
  __fd_00 = resolveAddress((char *)CONCAT44(in_register_00000034,__fd));
  if (__fd_00 != 0xffffffff) {
    iVar1 = bind(this,__fd_00,(sockaddr *)((ulong)__addr & 0xffff),__len);
    return iVar1;
  }
  return 0;
}

Assistant:

bool Socket::bind( const char * addr, uint16_t port )
{
    uint32_t ipaddr = resolveAddress(addr);
    if(ipaddr == 0xFFFFFFFF)
        return false;
    return bind(ipaddr, port);
}